

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O2

void __thiscall
diffusion::ShmReader::cyclic_read(ShmReader *this,vector<char,_std::allocator<char>_> *buffer)

{
  uint uVar1;
  uint uVar2;
  Offset OVar3;
  
  uVar2 = *(int *)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  while (0 < (int)uVar2) {
    uVar1 = this->shm_body_size_ - this->reader_shm_body_offset_;
    if ((int)uVar2 < (int)uVar1) {
      uVar1 = uVar2;
    }
    memcpy((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish + -(ulong)uVar2,this->shm_body_position_ + this->reader_shm_body_offset_,
           (long)(int)uVar1);
    uVar2 = uVar2 - uVar1;
    OVar3 = uVar1 + this->reader_shm_body_offset_;
    if (OVar3 == this->shm_body_size_) {
      OVar3 = 0;
    }
    this->reader_shm_body_offset_ = OVar3;
  }
  return;
}

Assistant:

void ShmReader::cyclic_read(std::vector<char> &buffer) {
    auto bytes_left = static_cast<Size>(buffer.size());
    while (bytes_left > 0) {
        auto write_pointer = buffer.data() + buffer.size() - bytes_left;
        auto space_left = shm_body_size_ - reader_shm_body_offset_;
        auto bytes_can_be_read_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(write_pointer, shm_body_position_ + reader_shm_body_offset_, bytes_can_be_read_without_wrap);
        reader_shm_body_offset_ += bytes_can_be_read_without_wrap;
        bytes_left -= bytes_can_be_read_without_wrap;
        if (reader_shm_body_offset_ == shm_body_size_) {
            reader_shm_body_offset_ = 0;
        }
    }
}